

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-metadce.cpp
# Opt level: O2

void __thiscall
MetaDCEGraph::scanWebAssembly()::InitScanner::visitRefFunc(wasm::RefFunc__(void *this,RefFunc *curr)

{
  mapped_type *pmVar1;
  IString local_30;
  
  if (*(long *)((long)this + 0xe8) != 0) {
    pmVar1 = std::__detail::
             _Map_base<wasm::Name,_std::pair<const_wasm::Name,_DCENode>,_std::allocator<std::pair<const_wasm::Name,_DCENode>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[](*(_Map_base<wasm::Name,_std::pair<const_wasm::Name,_DCENode>,_std::allocator<std::pair<const_wasm::Name,_DCENode>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            **)((long)this + 0xd8),(key_type *)((long)this + 0xe0));
    local_30.str = (string_view)
                   getDCEName(*(MetaDCEGraph **)((long)this + 0xd8),Function,
                              *(string_view *)(curr + 0x10));
    std::vector<wasm::Name,_std::allocator<wasm::Name>_>::emplace_back<wasm::Name>
              (&pmVar1->reaches,(Name *)&local_30);
    return;
  }
  __assert_fail("!parentDceName.isNull()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-metadce.cpp"
                ,0x95,"void MetaDCEGraph::scanWebAssembly()::InitScanner::visitRefFunc(RefFunc *)");
}

Assistant:

void visitRefFunc(RefFunc* curr) {
        assert(!parentDceName.isNull());
        parent->nodes[parentDceName].reaches.push_back(
          parent->getDCEName(ModuleItemKind::Function, curr->func));
      }